

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O1

bool __thiscall SNMPTrap::sendTo(SNMPTrap *this,IPAddress *ip,bool skipBuild)

{
  ComplexType *pCVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000011;
  uint8_t _packetBuffer [1400];
  undefined1 auStack_588 [1400];
  
  if ((int)CONCAT71(in_register_00000011,skipBuild) == 0) {
    bVar2 = buildForSending(this);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if ((this->_udp == (UDP *)0x0) ||
     (pCVar1 = (this->super_SNMPPacket).packet, bVar2 || pCVar1 == (ComplexType *)0x0)) {
    bVar2 = false;
  }
  else {
    memset(auStack_588,0,0x578);
    iVar3 = (*(pCVar1->super_BER_CONTAINER)._vptr_BER_CONTAINER[2])(pCVar1,auStack_588,0x578);
    bVar2 = 0 < iVar3;
  }
  return bVar2;
}

Assistant:

bool sendTo(const IPAddress& ip, bool skipBuild = false){
        bool buildStatus = true;
        if(!skipBuild) {
            buildStatus = this->buildForSending();
        }

        if(!_udp){
            return false;
        }

        if(!this->packet){
            return false;
        }

        if(!buildStatus){
            SNMP_LOGW("Failed Building packet..");
            return false;
        }

        uint8_t _packetBuffer[MAX_SNMP_PACKET_LENGTH] = {0};
        int length = packet->serialise(_packetBuffer, MAX_SNMP_PACKET_LENGTH);

        if(length <= 0) return false;

        _udp->beginPacket(ip, trapUDPport);
        _udp->write(_packetBuffer, length);
        return _udp->endPacket();
    }